

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O1

cmSourceFile * __thiscall
cmMakefile::CreateSource
          (cmMakefile *this,string *sourceName,bool generated,cmSourceFileLocationKind kind)

{
  pointer *pppcVar1;
  iterator iVar2;
  cmake *this_00;
  cmSourceFile *pcVar3;
  cmSourceFileLocation *pcVar4;
  vector<cmSourceFile*,std::allocator<cmSourceFile*>> *this_01;
  mapped_type *ppcVar5;
  cmSourceFile *sf;
  string name;
  cmSourceFile *local_50;
  string local_48;
  
  pcVar3 = (cmSourceFile *)operator_new(0x128);
  cmSourceFile::cmSourceFile(pcVar3,this,sourceName,kind);
  local_50 = pcVar3;
  if (generated) {
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"GENERATED","");
    cmSourceFile::SetProperty(pcVar3,&local_48,"1");
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
  }
  iVar2._M_current =
       (this->SourceFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->SourceFiles).super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::_M_realloc_insert<cmSourceFile*const&>
              ((vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)&this->SourceFiles,iVar2,
               &local_50);
  }
  else {
    *iVar2._M_current = local_50;
    pppcVar1 = &(this->SourceFiles).
                super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    *pppcVar1 = *pppcVar1 + 1;
  }
  this_00 = this->GlobalGenerator->CMakeInstance;
  pcVar4 = cmSourceFile::GetLocation(local_50);
  cmake::StripExtension(&local_48,this_00,&pcVar4->Name);
  this_01 = (vector<cmSourceFile*,std::allocator<cmSourceFile*>> *)
            std::__detail::
            _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
            ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                          *)&this->SourceFileSearchIndex,&local_48);
  iVar2._M_current = *(cmSourceFile ***)(this_01 + 8);
  if (iVar2._M_current == *(cmSourceFile ***)(this_01 + 0x10)) {
    std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>::_M_realloc_insert<cmSourceFile*const&>
              (this_01,iVar2,&local_50);
  }
  else {
    *iVar2._M_current = local_50;
    *(long *)(this_01 + 8) = *(long *)(this_01 + 8) + 8;
  }
  pcVar3 = local_50;
  if (kind == Known) {
    ppcVar5 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmSourceFile_*>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&this->KnownFileSearchIndex,sourceName);
    *ppcVar5 = pcVar3;
  }
  pcVar3 = local_50;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return pcVar3;
}

Assistant:

cmSourceFile* cmMakefile::CreateSource(const std::string& sourceName,
                                       bool generated,
                                       cmSourceFileLocationKind kind)
{
  cmSourceFile* sf = new cmSourceFile(this, sourceName, kind);
  if (generated) {
    sf->SetProperty("GENERATED", "1");
  }
  this->SourceFiles.push_back(sf);

  auto name =
    this->GetCMakeInstance()->StripExtension(sf->GetLocation().GetName());
#if defined(_WIN32) || defined(__APPLE__)
  name = cmSystemTools::LowerCase(name);
#endif
  this->SourceFileSearchIndex[name].push_back(sf);
  // for "Known" paths add direct lookup (used for faster lookup in GetSource)
  if (kind == cmSourceFileLocationKind::Known) {
    this->KnownFileSearchIndex[sourceName] = sf;
  }

  return sf;
}